

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O2

shared_ptr<TokenStream> __thiscall
TokenStream::tokenize(TokenStream *this,ProgramContext *program,string *data_,char *stream_name)

{
  char cVar1;
  Token TVar2;
  unsigned_long uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  char *__last;
  long lVar11;
  pair<const_char_*,_unsigned_long> *ppVar12;
  optional<std::pair<const_char_*,_unsigned_long>_> *poVar13;
  pair<const_char_*,_unsigned_long> *ppVar14;
  TokenStream *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t xpos;
  ulong uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  long lVar18;
  char *pcVar19;
  _Alloc_hider _Var20;
  char (*string) [8];
  char *pcVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  shared_ptr<TokenStream> sVar25;
  basic_string_view<char,_std::char_traits<char>_> __lhs;
  basic_string_view<char,_std::char_traits<char>_> __lhs_00;
  basic_string_view<char,_std::char_traits<char>_> __lhs_01;
  basic_string_view<char,_std::char_traits<char>_> __lhs_02;
  type __rhs;
  type __rhs_00;
  type __rhs_01;
  type __rhs_02;
  pair<unsigned_long,_unsigned_long> pos;
  pair<unsigned_long,_unsigned_long> pos_00;
  pair<unsigned_long,_unsigned_long> pos_01;
  pair<unsigned_long,_unsigned_long> pos_02;
  char *local_2a8;
  char *end;
  optional<std::pair<const_char_*,_size_t>_> opt_command;
  size_t local_280;
  vector<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  char *begin;
  char *local_250;
  anon_class_32_4_bba96b6b push_token;
  LexerContext lexer;
  anon_class_16_2_24ece30d push_newline;
  size_t local_128;
  optional<std::pair<const_char_*,_size_t>_> local_120;
  _Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> local_108;
  string local_e8;
  string local_c8;
  optional<std::pair<const_char_*,_size_t>_> next_token;
  TextStream local_90;
  
  std::__cxx11::string::string((string *)&local_c8,(string *)data_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,stream_name,(allocator<char> *)&push_token);
  LexerContext::LexerContext(&lexer,program,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar19 = lexer.stream.data._M_dataplus._M_p + lexer.stream.data._M_string_length;
  _Var20 = lexer.stream.data._M_dataplus;
  do {
    if (_Var20._M_p == pcVar19) {
      LexerContext::verify_nesting(&lexer);
      if (lexer.any_error == false) {
        this_00 = (TokenStream *)operator_new(0x90);
        TextStream::TextStream(&local_90,&lexer.stream);
        local_108._M_impl.super__Vector_impl_data._M_start =
             lexer.tokens.
             super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_108._M_impl.super__Vector_impl_data._M_finish =
             lexer.tokens.
             super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_108._M_impl.super__Vector_impl_data._M_end_of_storage =
             lexer.tokens.
             super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        lexer.tokens.
        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        lexer.tokens.
        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lexer.tokens.
        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        TokenStream(this_00,program,&local_90,
                    (vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> *)
                    &local_108);
        std::__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TokenStream,void>
                  ((__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
        std::_Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>::
        ~_Vector_base(&local_108);
        TextStream::~TextStream(&local_90);
      }
      else {
        (this->super_enable_shared_from_this<TokenStream>)._M_weak_this.
        super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (this->super_enable_shared_from_this<TokenStream>)._M_weak_this.
        super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      LexerContext::~LexerContext(&lexer);
      sVar25.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar25.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
      return (shared_ptr<TokenStream>)
             sVar25.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>;
    }
    push_token.begin_pos = (size_t *)CONCAT71(push_token.begin_pos._1_7_,10);
    __last = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (_Var20._M_p,pcVar19,&push_token);
    local_128 = (long)__last - (long)lexer.stream.data._M_dataplus._M_p;
    local_280 = (long)_Var20._M_p - (long)lexer.stream.data._M_dataplus._M_p;
    std::__cxx11::string::assign<char_const*,void>((string *)&lexer.line_buffer,_Var20._M_p,__last);
    _Var7 = lexer.line_buffer._M_dataplus;
    begin = lexer.line_buffer._M_dataplus._M_p;
    pcVar24 = lexer.line_buffer._M_dataplus._M_p + lexer.line_buffer._M_string_length;
    push_token.begin_pos = &local_280;
    push_token.begin = &begin;
    push_token.end = &end;
    push_newline.end_pos = &local_128;
    lVar22 = ((long)_Var20._M_p - (long)lexer.stream.data._M_dataplus._M_p) -
             (long)lexer.line_buffer._M_dataplus._M_p;
    bVar8 = 0;
    end = pcVar24;
    push_token.lexer = &lexer;
    push_newline.lexer = &lexer;
    for (_Var20 = lexer.line_buffer._M_dataplus; _Var20._M_p != pcVar24;
        _Var20._M_p = _Var20._M_p + 1) {
      cVar1 = *_Var20._M_p;
      if (lexer.comment_nest_level == 0 && cVar1 == '\"') {
        bVar8 = bVar8 ^ 1;
      }
      else {
        pcVar23 = _Var20._M_p + 1;
        if (!(bool)(pcVar23 == pcVar24 | bVar8)) {
          if (cVar1 == '*') {
            if (*pcVar23 == '/') {
              lVar11 = -1;
              if (lexer.comment_nest_level == 0) {
                LexerContext::error<char_const(&)[20]>
                          (&lexer,(size_t)(_Var20._M_p + lVar22),
                           (char (*) [20])"no comment to close");
              }
              else {
LAB_001b5e5c:
                lexer.comment_nest_level = lexer.comment_nest_level + lVar11;
                _Var20._M_p[0] = ' ';
                _Var20._M_p[1] = ' ';
              }
              bVar8 = 0;
              _Var20._M_p = pcVar23;
              goto LAB_001b5e75;
            }
          }
          else if (cVar1 == '/') {
            lVar11 = 1;
            if (*pcVar23 == '*') goto LAB_001b5e5c;
            if (*pcVar23 == '/') {
              memset(_Var20._M_p,0x20,(long)pcVar24 - (long)_Var20._M_p);
              break;
            }
          }
          bVar8 = 0;
        }
LAB_001b5e75:
        if (lexer.comment_nest_level != 0) {
          *_Var20._M_p = ' ';
        }
      }
    }
    _Var20._M_p = lexer.line_buffer._M_dataplus._M_p;
    sVar5 = local_280;
    pcVar23 = lexer.line_buffer._M_dataplus._M_p + lexer.line_buffer._M_string_length;
    pcVar24 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)>>
                        (lexer.line_buffer._M_dataplus._M_p,pcVar23,lex_isspace2);
    if ((pcVar24 == pcVar23) || (*pcVar24 != '#')) {
      if (lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] != '\0') {
        local_2a8 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)>>
                              (_Var7._M_p,end,lex_iswhite);
        next_token.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ = end;
        local_120.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ = local_2a8;
        std::find_if_not<std::reverse_iterator<char_const*>,bool(*)(int)>
                  ((reverse_iterator<const_char_*> *)&opt_command,
                   (reverse_iterator<const_char_*> *)&next_token,(_func_bool_int *)&local_120);
        end = (char *)CONCAT71(opt_command.
                               super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._1_7_,
                               opt_command.
                               super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_);
        if (end != local_2a8) {
          if ((((lexer.program)->opt).pedantic == true) &&
             (0xff < lexer.line_buffer._M_string_length)) {
            LexerContext::pedantic<char_const(&)[63]>
                      (&lexer,local_280,
                       (char (*) [63])
                       "line is too long, miss2 only allows 255 characters [-pedantic]");
          }
          if (lexer.in_dump_mode == true) {
            pcVar24 = local_2a8;
            lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)&tokens,local_2a8,end);
            if ((char)tokens.
                      super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == '\x01') {
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*((optional<std::pair<const_char_*,_unsigned_long>_> *)&tokens);
              bVar9 = lex_istokeq<8ul>(ppVar12,(char (*) [8])pcVar24);
              pcVar23 = begin;
              sVar6 = local_280;
              pcVar24 = end;
              if (!bVar9) {
                LexerContext::hint_will_push_tokens(&lexer,((long)end - (long)local_2a8) / 3);
                local_250 = local_2a8 + (sVar6 - (long)pcVar23);
                pcVar23 = local_2a8;
                while( true ) {
                  lex_gettok(&opt_command,pcVar23,pcVar24);
                  if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_
                      != true) break;
                  ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                            operator->(&opt_command);
                  pcVar23 = local_250 + ((long)ppVar12->first - (long)local_2a8);
                  ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                            operator->(&opt_command);
                  cVar1 = *ppVar12->first;
                  ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                            operator->(&opt_command);
                  if (cVar1 == '\"') {
                    pcVar23 = lex_token(&lexer,ppVar12->first,pcVar24,(size_t)pcVar23);
                  }
                  else {
                    uVar3 = ppVar12->second;
                    ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                              operator->(&opt_command);
                    if ((uVar3 & 1) == 0) {
                      pcVar21 = ppVar12->first;
                      ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>
                                ::operator->(&opt_command);
                      pcVar4 = ppVar12->first;
                      ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>
                                ::operator->(&opt_command);
                      bVar9 = std::all_of<char_const*,bool(*)(int)>
                                        (pcVar21,pcVar4 + ppVar12->second,lex_isxdigit);
                      if (bVar9) {
                        uVar15 = 0;
                        while( true ) {
                          ppVar12 = std::experimental::
                                    optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                                              (&opt_command);
                          if (ppVar12->second <= uVar15) break;
                          ppVar12 = std::experimental::
                                    optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                                              (&opt_command);
                          pcVar21 = ppVar12->first;
                          bVar9 = lex_isxdigit((int)pcVar21[uVar15]);
                          if ((bVar9) && (bVar9 = lex_isxdigit((int)pcVar21[uVar15 + 1]), bVar9)) {
                            LexerContext::add_token(&lexer,Hexadecimal,(size_t)pcVar23,2);
                          }
                          else {
                            pos.second = (unsigned_long)(pcVar23 + 2);
                            pos.first = (unsigned_long)pcVar23;
                            LexerContext::error<char_const(&)[26]>
                                      (&lexer,pos,(char (*) [26])"invalid hexadecimal token");
                          }
                          uVar15 = uVar15 + 2;
                          pcVar23 = pcVar23 + 2;
                        }
                      }
                      else {
                        ppVar12 = std::experimental::
                                  optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                                            (&opt_command);
                        pos_01.second = pcVar23 + ppVar12->second;
                        pos_01.first = (unsigned_long)pcVar23;
                        LexerContext::error<char_const(&)[26]>
                                  (&lexer,pos_01,(char (*) [26])"invalid hexadecimal token");
                      }
                    }
                    else {
                      pos_00.second = pcVar23 + ppVar12->second;
                      pos_00.first = (unsigned_long)pcVar23;
                      LexerContext::error<char_const(&)[49]>
                                (&lexer,pos_00,
                                 (char (*) [49])"hexadecimal tokens must have pairs of two digits");
                    }
                    ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                              operator->(&opt_command);
                    pcVar23 = ppVar12->first;
                    ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                              operator->(&opt_command);
                    pcVar23 = std::
                              __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)>>
                                        (pcVar23 + ppVar12->second,pcVar24,lex_iswhite);
                  }
                }
                lex_line::anon_class_16_2_24ece30d::operator()(&push_newline);
                goto LAB_001b6877;
              }
            }
          }
          lex_gettok(&opt_command,local_2a8,end);
          if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true)
          {
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator->(&opt_command);
            pcVar24 = ppVar12->first;
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator->(&opt_command);
            if (pcVar24[ppVar12->second - 1] == ':') {
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*(&opt_command);
              local_2a8 = lex_line::anon_class_32_4_bba96b6b::operator()(&push_token,ppVar12,Label);
            }
          }
          lex_gettok(&opt_command,local_2a8,end);
          bVar9 = lexer.in_dump_mode;
          if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true)
          {
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            string = (char (*) [8])0x20714e;
            bVar10 = lex_istokeq(ppVar12,"DUMP",4);
            bVar9 = true;
            if (!bVar10) {
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*(&opt_command);
              bVar10 = lex_istokeq<8ul>(ppVar12,string);
              bVar9 = lexer.in_dump_mode;
              if (bVar10) {
                bVar9 = false;
              }
            }
          }
          lexer.in_dump_mode = bVar9;
          lex_gettok(&opt_command,local_2a8,end);
          if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true)
          {
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            bVar9 = lex_istokeq<3ul>(ppVar12,(char (*) [3])0x2075b1);
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            if (bVar9) {
              TVar2 = IF;
            }
            else {
              bVar9 = lex_istokeq(ppVar12,"WHILE",5);
              if (!bVar9) {
                uVar17 = 0;
                goto LAB_001b62c9;
              }
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*(&opt_command);
              TVar2 = WHILE;
            }
            local_2a8 = lex_line::anon_class_32_4_bba96b6b::operator()(&push_token,ppVar12,TVar2);
            uVar17 = CONCAT71((int7)(sVar5 >> 8),1);
          }
          else {
            uVar17 = 0;
          }
LAB_001b62c9:
          lex_gettok(&opt_command,local_2a8,end);
          if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true)
          {
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            bVar9 = lex_istokeq<4ul>(ppVar12,(char (*) [4])"AND");
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            if (bVar9) {
              TVar2 = AND;
            }
            else {
              bVar9 = lex_istokeq<3ul>(ppVar12,(char (*) [3])0x1fb99a);
              if (!bVar9) goto LAB_001b6346;
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*(&opt_command);
              TVar2 = OR;
            }
            local_2a8 = lex_line::anon_class_32_4_bba96b6b::operator()(&push_token,ppVar12,TVar2);
            uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),1);
          }
LAB_001b6346:
          uVar16 = (undefined4)uVar17;
          lex_gettok(&opt_command,local_2a8,end);
          if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true)
          {
            ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                      operator*(&opt_command);
            bVar9 = lex_istokeq<4ul>(ppVar12,(char (*) [4])"NOT");
            if (bVar9) {
              ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                        operator*(&opt_command);
              local_2a8 = lex_line::anon_class_32_4_bba96b6b::operator()(&push_token,ppVar12,NOT);
              uVar16 = (undefined4)CONCAT71((int7)((ulong)uVar17 >> 8),1);
            }
          }
          pcVar24 = end;
          if (local_2a8 == end) {
LAB_001b6769:
            if (local_2a8 == pcVar24) {
              if ((char)uVar16 == '\0') goto LAB_001b6877;
            }
            else {
              lVar22 = local_280 - (long)begin;
              lex_gettok(&opt_command,local_2a8,pcVar24);
              if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ ==
                  true) {
                local_250 = (char *)CONCAT44(local_250._4_4_,uVar16);
                ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                          operator->(&opt_command);
                pcVar23 = ppVar12->first;
                ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                          operator->(&opt_command);
                pcVar23 = pcVar23 + ppVar12->second;
                lVar11 = 0;
                do {
                  lVar18 = lVar11;
                  if (lVar18 == 0x2b8) {
                    ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                              operator->(&opt_command);
                    pcVar21 = ppVar12->first;
                    ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                              operator->(&opt_command);
                    LexerContext::add_token
                              (&lexer,Command,(size_t)(pcVar21 + lVar22),ppVar12->second);
                    goto LAB_001b68cc;
                  }
                  ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                            operator*(&opt_command);
                  bVar9 = lex_istokeq(ppVar12,*(char **)((long)&keycommands[0].first.__data + lVar18
                                                        ),
                                      *(size_t *)((long)&keycommands[0].first.__size + lVar18));
                  lVar11 = lVar18 + 0x18;
                } while (!bVar9);
                ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                          operator->(&opt_command);
                pcVar21 = ppVar12->first;
                if ((char)local_250 != '\0') {
                  ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                            operator->(&opt_command);
                  pos_02.second = ppVar12->second;
                  pos_02.first = (unsigned_long)(pcVar21 + lVar22);
                  LexerContext::error<char_const(&)[17]>
                            (&lexer,pos_02,(char (*) [17])"unexpected token");
                }
                TVar2 = *(Token *)((long)&keycommands[0].second + lVar18);
                ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::
                          operator->(&opt_command);
                LexerContext::add_token(&lexer,TVar2,(size_t)(pcVar21 + lVar22),ppVar12->second);
LAB_001b68cc:
                for (; pcVar23 != pcVar24;
                    pcVar23 = lex_token(&lexer,pcVar23,pcVar24,(size_t)(pcVar23 + lVar22))) {
                }
              }
            }
          }
          else {
            bVar9 = lex_isexprc(local_2a8,end);
            pcVar23 = local_2a8;
            if (!bVar9) {
              while ((pcVar21 = pcVar24, pcVar23 != pcVar24 &&
                     (((pcVar21 = pcVar23, 0x2c < (ulong)(byte)*pcVar23 ||
                       ((0x130100002200U >> ((ulong)(byte)*pcVar23 & 0x3f) & 1) == 0)) &&
                      (bVar9 = lex_isexprc(pcVar23,pcVar24), !bVar9))))) {
                pcVar23 = pcVar23 + 1;
              }
              pcVar23 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)>>
                                  (pcVar21,pcVar24,lex_iswhite);
              pcVar24 = end;
              if ((pcVar23 == end) || (bVar9 = lex_isexprc(pcVar23,end), !bVar9)) goto LAB_001b6769;
            }
            lex_expr(&lexer,local_2a8,pcVar24,(size_t)(local_2a8 + (local_280 - (long)begin)));
          }
          lex_line::anon_class_16_2_24ece30d::operator()(&push_newline);
        }
      }
    }
    else {
      pcVar21 = pcVar24 + (sVar5 - (long)_Var20._M_p);
      if (((lexer.program)->opt).pedantic == true) {
        LexerContext::pedantic<char_const(&)[49]>
                  (&lexer,(size_t)pcVar21,
                   (char (*) [49])"preprocessor is a language extension [-pedantic]");
      }
      lex_gettok(&opt_command,pcVar24 + 1,pcVar23);
      if (opt_command.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
        ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                            (&opt_command);
        pcVar24 = ppVar12->first;
        ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                            (&opt_command);
        uVar3 = ppVar12->second;
        tokens.
        super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tokens.
        super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tokens.
        super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::optional
                  (&next_token,&opt_command);
        while( true ) {
          ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                              (&next_token);
          pcVar4 = ppVar12->first;
          ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                              (&next_token);
          lex_gettok(&local_120,pcVar4 + ppVar12->second,pcVar23);
          poVar13 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator=
                              (&next_token,&local_120);
          if ((poVar13->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).init_ != true)
          break;
          ppVar12 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                              (&next_token);
          ppVar14 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator->
                              (&next_token);
          std::
          vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
          ::emplace_back<char_const*&,unsigned_long&>
                    ((vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                      *)&tokens,&ppVar12->first,&ppVar14->second);
        }
        __lhs.__size = uVar3;
        __lhs.__data = pcVar24;
        __rhs.__size = 5;
        __rhs.__data = "ifdef";
        bVar9 = libcxx_strviewclone::operator==(__lhs,__rhs);
        if ((bVar9) ||
           (__lhs_00.__size = uVar3, __lhs_00.__data = pcVar24, __rhs_00.__size = 6,
           __rhs_00.__data = "ifndef", bVar9 = libcxx_strviewclone::operator==(__lhs_00,__rhs_00),
           bVar9)) {
          if ((long)tokens.
                    super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)tokens.
                    super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            LexerContext::error<char_const(&)[49]>
                      (&lexer,(size_t)pcVar21,
                       (char (*) [49])"wrong number of tokens in preprocessor directive");
          }
          if (tokens.
              super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              tokens.
              super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            cVar1 = lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
            bVar9 = Options::is_defined(&(lexer.program)->opt,
                                        tokens.
                                        super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
            if (pcVar24[2] == 'n') {
              if (!bVar9) goto LAB_001b648a;
LAB_001b6188:
              bVar9 = false;
            }
            else {
              if (!bVar9) goto LAB_001b6188;
LAB_001b648a:
              bVar9 = cVar1 != '\0';
            }
            local_120.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ = bVar9;
            std::vector<char,_std::allocator<char>_>::emplace_back<bool>
                      (&lexer.cpp_stack,(bool *)&local_120);
          }
        }
        else {
          __lhs_01.__size = uVar3;
          __lhs_01.__data = pcVar24;
          __rhs_01.__size = 4;
          __rhs_01.__data = "else";
          bVar9 = libcxx_strviewclone::operator==(__lhs_01,__rhs_01);
          if (bVar9) {
            if (tokens.
                super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                tokens.
                super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              LexerContext::error<char_const(&)[42]>
                        (&lexer,(size_t)pcVar21,
                         (char (*) [42])"too many tokens in preprocessor directive");
            }
            if ((ulong)((long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_start) < 2) {
              LexerContext::error<char_const(&)[21]>
                        (&lexer,(size_t)pcVar21,(char (*) [21])"#else without #ifdef");
            }
            else if (lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [((long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) - 2] != '\0') {
              lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] =
                   lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1] == '\0';
            }
          }
          else {
            __lhs_02.__size = uVar3;
            __lhs_02.__data = pcVar24;
            __rhs_02.__size = 5;
            __rhs_02.__data = "endif";
            bVar9 = libcxx_strviewclone::operator==(__lhs_02,__rhs_02);
            if (bVar9) {
              if (tokens.
                  super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  tokens.
                  super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                LexerContext::error<char_const(&)[42]>
                          (&lexer,(size_t)pcVar21,
                           (char (*) [42])"too many tokens in preprocessor directive");
              }
              if ((ulong)((long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start) < 2) {
                LexerContext::error<char_const(&)[22]>
                          (&lexer,(size_t)pcVar21,(char (*) [22])"#endif without #ifdef");
              }
              else {
                lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     lexer.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
              }
            }
            else {
              LexerContext::error<char_const(&)[31]>
                        (&lexer,(size_t)pcVar21,(char (*) [31])"unknown preprocessor directive");
            }
          }
        }
        std::
        _Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~_Vector_base(&tokens.
                         super__Vector_base<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
                       );
      }
    }
LAB_001b6877:
    _Var20._M_p = __last + (__last != pcVar19);
  } while( true );
}

Assistant:

std::shared_ptr<TokenStream> TokenStream::tokenize(ProgramContext& program, std::string data_, const char* stream_name)
{
    LexerContext lexer(program, std::move(data_), stream_name);

    auto begin = lexer.stream.data.c_str();
    auto end = lexer.stream.data.c_str() + lexer.stream.data.size();

    for(auto it = begin; it != end; )
    {
        const char *line_start = it;
        const char *line_end   = std::find(it, end, '\n');

        lex_line(lexer, begin, std::distance(begin, line_start), std::distance(begin, line_end));
        it = (line_end == end? line_end : std::next(line_end));
    }

    lexer.verify_nesting();

    if(!lexer.any_error)
        return shared_ptr<TokenStream>(new TokenStream(program, std::move(lexer.stream), std::move(lexer.tokens)));
    else
        return nullptr;
}